

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O3

size_t __thiscall
merlin::config_index::convert
          (config_index *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *config)

{
  pointer pvVar1;
  pointer pvVar2;
  _Base_ptr p_Var3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Rb_tree_header *p_Var14;
  bool bVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_38,
             (long)(this->m_vars).
                   super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_vars).
                   super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  pvVar1 = (this->m_vars).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->m_vars).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pvVar2 - (long)pvVar1 >> 4;
  if (pvVar2 != pvVar1) {
    p_Var3 = (config->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var14 = &(config->_M_t)._M_impl.super__Rb_tree_header;
    lVar11 = 0;
    do {
      if (p_Var3 != (_Base_ptr)0x0) {
        uVar8 = pvVar1[lVar11].m_label;
        p_Var12 = &p_Var14->_M_header;
        p_Var13 = p_Var3;
        do {
          if (*(ulong *)(p_Var13 + 1) >= uVar8) {
            p_Var12 = p_Var13;
          }
          p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uVar8];
        } while (p_Var13 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var12 != p_Var14) && (*(ulong *)(p_Var12 + 1) <= uVar8)) {
          local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar11] = (unsigned_long)p_Var12[1]._M_parent;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar6 + (ulong)(lVar6 == 0));
  }
  if ((long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != lVar6) {
    __assert_fail("values.size() == m_vars.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/index.h"
                  ,0x255,"size_t merlin::config_index::convert(std::map<size_t, size_t> &)");
  }
  puVar4 = (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->m_bigendian == true) {
    lVar6 = (long)puVar4 - (long)puVar5;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 3;
      lVar11 = 1;
      lVar10 = 0;
      sVar9 = 0;
      do {
        sVar9 = sVar9 + local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar10] * lVar11;
        lVar11 = lVar11 * puVar5[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar10);
      goto LAB_0013e8d5;
    }
  }
  else {
    uVar7 = (int)((ulong)((long)puVar4 - (long)puVar5) >> 3) - 1;
    if (-1 < (int)uVar7) {
      uVar8 = (ulong)uVar7;
      lVar6 = 1;
      sVar9 = 0;
      do {
        sVar9 = sVar9 + local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar8] * lVar6;
        lVar6 = lVar6 * puVar5[uVar8];
        bVar15 = uVar8 != 0;
        uVar8 = uVar8 - 1;
      } while (bVar15);
      goto LAB_0013e8d5;
    }
  }
  sVar9 = 0;
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return 0;
  }
LAB_0013e8d5:
  operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start);
  return sVar9;
}

Assistant:

size_t convert(std::map<size_t, size_t>& config) {
		// The source variables are a subset of the config vector

		std::vector<size_t> values;
		values.resize(m_vars.size());
		for (size_t i = 0; i < m_vars.size(); ++i) {
			size_t var = m_vars[i].label();
			std::map<size_t, size_t>::iterator mi = config.find(var);
			if (mi != config.end()) {
				size_t val = mi->second;
				values[i] = val;
			}
		}

		// Safety checks
		assert(values.size() == m_vars.size());

		size_t index = 0, offset = 1;
		if (m_bigendian) { // start from the first variable
			for (size_t i = 0; i < m_dims.size(); ++i) {
				index += values[i]*offset;
				offset *= m_dims[i];
			}
		} else {
			for (int i = m_dims.size()-1; i >= 0; --i) {
				index += values[i]*offset;
				offset *= m_dims[i];
			}
		}

		return index;
	}